

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

double calc_mean_only<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  unsigned_long *__last;
  unsigned_long *puVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar7;
  undefined1 auVar8 [16];
  long in_stack_00000008;
  size_t *row;
  double m;
  size_t added;
  size_t cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  byte local_a2;
  unsigned_long *in_stack_ffffffffffffff70;
  unsigned_long *in_stack_ffffffffffffff78;
  unsigned_long *in_stack_ffffffffffffff80;
  ulong local_78;
  ulong local_70;
  long local_50;
  unsigned_long *local_8;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    local_8 = (unsigned_long *)0x0;
  }
  else {
    local_50 = *(long *)(in_stack_00000008 + in_RCX * 8);
    lVar1 = *(long *)(in_stack_00000008 + 8 + in_RCX * 8);
    lVar5 = lVar1 + -1;
    uVar2 = *(ulong *)(in_R9 + lVar5 * 8);
    __last = std::lower_bound<unsigned_long*,unsigned_long>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff70);
    local_70 = (in_RDX - in_RSI) + 1;
    local_78 = 0;
    local_8 = (unsigned_long *)0x0;
    while( true ) {
      bVar7 = false;
      if ((__last != (unsigned_long *)(in_RDI + in_RDX * 8 + 8)) &&
         (bVar7 = false, local_50 != lVar1)) {
        bVar7 = *__last <= uVar2;
      }
      if (!bVar7) break;
      if (*(unsigned_long *)(in_R9 + local_50 * 8) == *__last) {
        uVar3 = std::isnan(*(double *)(in_R8 + local_50 * 8));
        local_a2 = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf(*(double *)(in_R8 + local_50 * 8));
          local_a2 = (byte)iVar4;
        }
        if ((local_a2 & 1) == 0) {
          local_78 = local_78 + 1;
          auVar8._8_4_ = (int)(local_78 >> 0x20);
          auVar8._0_8_ = local_78;
          auVar8._12_4_ = 0x45300000;
          local_8 = (unsigned_long *)
                    ((*(double *)(in_R8 + local_50 * 8) - (double)local_8) /
                     ((auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) +
                    (double)local_8);
        }
        else {
          local_70 = local_70 - 1;
        }
        if ((__last == (unsigned_long *)(in_RDI + in_RDX * 8)) || (local_50 == lVar5)) break;
        __last = __last + 1;
        puVar6 = std::lower_bound<unsigned_long*,unsigned_long>
                           (local_8,__last,in_stack_ffffffffffffff70);
        local_50 = (long)puVar6 - in_R9 >> 3;
      }
      else if (*__last < *(ulong *)(in_R9 + local_50 * 8)) {
        __last = std::lower_bound<unsigned_long*,unsigned_long>
                           (local_8,__last,in_stack_ffffffffffffff70);
      }
      else {
        puVar6 = std::lower_bound<unsigned_long*,unsigned_long>
                           (local_8,__last,in_stack_ffffffffffffff70);
        local_50 = (long)puVar6 - in_R9 >> 3;
      }
    }
    if (local_78 == 0) {
      local_8 = (unsigned_long *)0x0;
    }
    else if (local_78 < local_70) {
      local_8 = (unsigned_long *)
                (double)((float)(double)local_8 *
                        (((float)(&DAT_006c0110)[(long)local_78 < 0] + (float)(long)local_78) /
                        ((float)(&DAT_006c0110)[(long)local_70 < 0] + (float)(long)local_70)));
    }
  }
  return (double)local_8;
}

Assistant:

double calc_mean_only(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    double m = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
                cnt--;
            else
                m += (Xc[curr_pos] - m) / (double)(++added);

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= ((ldouble_safe)added / (ldouble_safe)cnt);

    return m;
}